

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_utility.h
# Opt level: O0

vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *
testinator::Arbitrary<std::pair<int,_float>_>::shrink
          (vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
           *__return_storage_ptr__,pair<int,_float> *p)

{
  bool bVar1;
  reference __args;
  reference __args_1;
  float *e_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<float,_std::allocator<float>_> *__range2_1;
  vector<float,_std::allocator<float>_> second_v;
  int *e;
  iterator __end0;
  iterator __begin0;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> first_v;
  pair<int,_float> *p_local;
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *ret;
  
  first_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  memset(__return_storage_ptr__,0,0x18);
  ::std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::vector
            (__return_storage_ptr__);
  detail::Arbitrary_Arithmetic<int>::shrink
            ((vector<int,_std::allocator<int>_> *)&__range2,&p->first);
  __end0 = ::std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)&__range2);
  e = (int *)::std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)&__range2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &e);
    if (!bVar1) break;
    __args = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end0);
    ::std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
    emplace_back<int,float_const&>
              ((vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)
               __return_storage_ptr__,__args,&p->second);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0);
  }
  detail::Arbitrary_Arithmetic_Real<float>::shrink
            ((vector<float,_std::allocator<float>_> *)&__range2_1,&p->second);
  __end0_1 = ::std::vector<float,_std::allocator<float>_>::begin
                       ((vector<float,_std::allocator<float>_> *)&__range2_1);
  e_1 = (float *)::std::vector<float,_std::allocator<float>_>::end
                           ((vector<float,_std::allocator<float>_> *)&__range2_1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0_1,
                       (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                       &e_1);
    if (!bVar1) break;
    __args_1 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(&__end0_1);
    ::std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
    emplace_back<int_const&,float>
              ((vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)
               __return_storage_ptr__,&p->first,__args_1);
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&__end0_1);
  }
  first_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  ::std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&__range2_1);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range2);
  if ((first_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._7_1_ & 1) == 0) {
    ::std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::pair<T1, T2>> shrink(const std::pair<T1, T2>& p)
    {
      std::vector<std::pair<T1, T2>> ret{};

      // shrink the first
      auto first_v = Arbitrary<std::decay_t<T1>>::shrink(p.first);
      for (auto& e : first_v)
      {
        ret.emplace_back(std::move(e), p.second);
      }

      // shrink the second
      auto second_v = Arbitrary<std::decay_t<T2>>::shrink(p.second);
      for (auto& e : second_v)
      {
        ret.emplace_back(p.first, std::move(e));
      }

      return ret;
    }